

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerGLSL::remove_duplicate_swizzle(CompilerGLSL *this,string *op)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  ulong local_90;
  size_type i_1;
  size_type prevpos;
  uint32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [36];
  undefined4 local_4c;
  string local_48 [8];
  string final_swiz;
  size_type pos;
  string *op_local;
  CompilerGLSL *this_local;
  
  uVar2 = ::std::__cxx11::string::find_last_of((char)op,0x2e);
  if ((uVar2 == 0xffffffffffffffff) || (uVar2 == 0)) {
    return false;
  }
  ::std::__cxx11::string::substr((ulong)local_48,(ulong)op);
  if (((this->backend).swizzle_is_function & 1U) != 0) {
    uVar3 = ::std::__cxx11::string::size();
    if (uVar3 < 2) {
      this_local._7_1_ = false;
      goto LAB_002ea4d8;
    }
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::substr((ulong)local_70,(ulong)local_48);
    bVar1 = ::std::operator==(local_70,"()");
    ::std::__cxx11::string::~string((string *)local_70);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_002ea4d8;
    }
    lVar4 = ::std::__cxx11::string::size();
    ::std::__cxx11::string::erase((ulong)local_48,lVar4 - 2);
  }
  for (prevpos._0_4_ = 0; uVar3 = ::std::__cxx11::string::size(), (uint)prevpos < uVar3;
      prevpos._0_4_ = (uint)prevpos + 1) {
    if ((3 < (uint)prevpos) ||
       (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_48),
       *pcVar5 != "xyzw"[(uint)prevpos])) {
      this_local._7_1_ = false;
      goto LAB_002ea4d8;
    }
  }
  lVar4 = ::std::__cxx11::string::find_last_of((char)op,0x2e);
  if (lVar4 == -1) {
    this_local._7_1_ = false;
  }
  else {
    uVar3 = lVar4 + 1;
    for (local_90 = uVar3; local_90 < uVar2; local_90 = local_90 + 1) {
      pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)op);
      if ((*pcVar5 < 'w') ||
         (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)op), 'z' < *pcVar5)) {
        if ((((this->backend).swizzle_is_function & 1U) == 0) ||
           (((local_90 + 2 != uVar2 ||
             (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)op), *pcVar5 != '(')) ||
            (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)op), *pcVar5 != ')')))) {
          this_local._7_1_ = false;
          goto LAB_002ea4d8;
        }
        break;
      }
    }
    uVar6 = ::std::__cxx11::string::size();
    if (uVar6 <= uVar2 - uVar3) {
      lVar4 = ::std::__cxx11::string::size();
      ::std::__cxx11::string::erase((ulong)op,uVar3 + lVar4);
      if (((this->backend).swizzle_is_function & 1U) != 0) {
        ::std::__cxx11::string::operator+=((string *)op,"()");
      }
    }
    this_local._7_1_ = true;
  }
LAB_002ea4d8:
  local_4c = 1;
  ::std::__cxx11::string::~string(local_48);
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::remove_duplicate_swizzle(string &op)
{
	auto pos = op.find_last_of('.');
	if (pos == string::npos || pos == 0)
		return false;

	string final_swiz = op.substr(pos + 1, string::npos);

	if (backend.swizzle_is_function)
	{
		if (final_swiz.size() < 2)
			return false;

		if (final_swiz.substr(final_swiz.size() - 2, string::npos) == "()")
			final_swiz.erase(final_swiz.size() - 2, string::npos);
		else
			return false;
	}

	// Check if final swizzle is of form .x, .xy, .xyz, .xyzw or similar.
	// If so, and previous swizzle is of same length,
	// we can drop the final swizzle altogether.
	for (uint32_t i = 0; i < final_swiz.size(); i++)
	{
		static const char expected[] = { 'x', 'y', 'z', 'w' };
		if (i >= 4 || final_swiz[i] != expected[i])
			return false;
	}

	auto prevpos = op.find_last_of('.', pos - 1);
	if (prevpos == string::npos)
		return false;

	prevpos++;

	// Make sure there are only swizzles here ...
	for (auto i = prevpos; i < pos; i++)
	{
		if (op[i] < 'w' || op[i] > 'z')
		{
			// If swizzles are foo.xyz() like in C++ backend for example, check for that.
			if (backend.swizzle_is_function && i + 2 == pos && op[i] == '(' && op[i + 1] == ')')
				break;
			return false;
		}
	}

	// If original swizzle is large enough, just carve out the components we need.
	// E.g. foobar.wyx.xy will turn into foobar.wy.
	if (pos - prevpos >= final_swiz.size())
	{
		op.erase(prevpos + final_swiz.size(), string::npos);

		// Add back the function call ...
		if (backend.swizzle_is_function)
			op += "()";
	}
	return true;
}